

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

int ** clone_matrix<int>(int **matrix,int row,int col)

{
  int **ppiVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  int **ret_val;
  int col_local;
  int row_local;
  int **matrix_local;
  
  ppiVar1 = new_matrix<int>(row,col);
  for (local_24 = 0; local_24 < row; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < col; local_28 = local_28 + 1) {
      ppiVar1[local_24][local_28] = matrix[local_24][local_28];
    }
  }
  return ppiVar1;
}

Assistant:

T** clone_matrix(T** matrix, int row, int col)
{
    T** ret_val = new_matrix<T>(row, col);

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            ret_val[i][j] = matrix[i][j];
        }
    }

    return ret_val;
}